

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::PaddingLayerParams::ByteSizeLong(PaddingLayerParams *this)

{
  uint32 uVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  uint uVar5;
  
  if (this->paddingamounts_ == (BorderAmounts *)0x0 ||
      this == (PaddingLayerParams *)&_PaddingLayerParams_default_instance_) {
    sVar4 = 0;
  }
  else {
    sVar4 = BorderAmounts::ByteSizeLong(this->paddingamounts_);
    uVar5 = (uint)sVar4 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  uVar1 = this->_oneof_case_[0];
  if ((uVar1 == 3) || (uVar1 == 2)) {
    ((this->PaddingType_).constant_)->value_ = 0.0;
    sVar4 = sVar4 + 2;
  }
  else if (uVar1 == 1) {
    lVar3 = (ulong)(-(uint)(((this->PaddingType_).constant_)->value_ != 0.0) & 1) * 5;
    ((this->PaddingType_).constant_)->_cached_size_ = (int)lVar3;
    sVar4 = sVar4 + lVar3 + 2;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t PaddingLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.PaddingLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.BorderAmounts paddingAmounts = 10;
  if (this->has_paddingamounts()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->paddingamounts_);
  }

  switch (PaddingType_case()) {
    // .CoreML.Specification.PaddingLayerParams.PaddingConstant constant = 1;
    case kConstant: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PaddingType_.constant_);
      break;
    }
    // .CoreML.Specification.PaddingLayerParams.PaddingReflection reflection = 2;
    case kReflection: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PaddingType_.reflection_);
      break;
    }
    // .CoreML.Specification.PaddingLayerParams.PaddingReplication replication = 3;
    case kReplication: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PaddingType_.replication_);
      break;
    }
    case PADDINGTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}